

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_lengthi<char,char16_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  bool bVar1;
  jessilib *pjVar2;
  jessilib *extraout_RDX;
  char *pcVar4;
  jessilib *this;
  size_t sVar5;
  jessilib *this_00;
  decode_result dVar6;
  decode_result dVar7;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  char16_t *local_48;
  size_t local_40;
  size_t sVar3;
  
  local_48 = in_prefix._M_str;
  pjVar2 = (jessilib *)in_prefix._M_len;
  pcVar4 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  sVar5 = 0;
  this_00 = pjVar2;
  while( true ) {
    if ((this == (jessilib *)0x0) || (this_00 == (jessilib *)0x0)) {
      local_40 = 0;
      if (this_00 == (jessilib *)0x0) {
        local_40 = sVar5;
      }
      return local_40;
    }
    in_string_00._M_str = (char *)pjVar2;
    in_string_00._M_len = (size_t)pcVar4;
    dVar6 = decode_codepoint_utf8<char>(this,in_string_00);
    in_string_01._M_str = (char16_t *)dVar6.units;
    in_string_01._M_len = (size_t)local_48;
    dVar7 = decode_codepoint_utf16<char16_t>(this_00,in_string_01);
    sVar3 = dVar7.units;
    if (in_string_01._M_str == (char16_t *)0x0) {
      return 0;
    }
    if (sVar3 == 0) break;
    bVar1 = equalsi(dVar6.codepoint,dVar7.codepoint);
    if (!bVar1) {
      return 0;
    }
    pcVar4 = pcVar4 + (long)in_string_01._M_str;
    this = this + -(long)in_string_01._M_str;
    local_48 = local_48 + sVar3;
    this_00 = this_00 + -sVar3;
    sVar5 = sVar5 + (long)in_string_01._M_str;
    pjVar2 = extraout_RDX;
  }
  return 0;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}